

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::SubroutineFunctionSet::push_back
          (SubroutineFunctionSet *this,SubroutineFunction *_fn)

{
  pointer *ppSVar1;
  allocator_type *__a;
  undefined8 *puVar2;
  SubroutineFunction *this_00;
  SubroutineFunction *pSVar3;
  allocator_type *paVar4;
  SubroutineFunction *__p;
  undefined8 uVar5;
  ulong uVar6;
  pointer pSVar7;
  char *pcVar8;
  ulong uVar9;
  allocator_type *paVar10;
  SubroutineFunction *pSVar11;
  long lVar12;
  _Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  *this_01;
  long lVar13;
  pointer pSVar14;
  
  this_00 = (this->fn).
            super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 ==
      (this->fn).
      super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pSVar3 = (this->fn).
             super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)this_00 - (long)pSVar3;
    if (lVar12 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar9 = (lVar12 >> 3) * 0xf83e0f83e0f83e1;
    uVar6 = 1;
    if (this_00 != pSVar3) {
      uVar6 = uVar9;
    }
    this_01 = (_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
               *)(uVar6 + uVar9);
    if ((_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
         *)0x7c1f07c1f07c1e < this_01) {
      this_01 = (_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                 *)0x7c1f07c1f07c1f;
    }
    if (CARRY8(uVar6,uVar9)) {
      this_01 = (_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                 *)0x7c1f07c1f07c1f;
    }
    pSVar7 = std::
             _Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             ::_M_allocate(this_01,(size_t)_fn);
    SubroutineFunction::SubroutineFunction((SubroutineFunction *)(lVar12 + (long)pSVar7),_fn);
    pSVar14 = pSVar7;
    if (this_00 != pSVar3) {
      lVar12 = 0;
      do {
        lVar13 = lVar12;
        __a = (allocator_type *)((long)&(pSVar3->index).super_LayoutSpecifierBase.val + lVar13);
        *(undefined4 *)
         ((long)&(pSVar7->index).super_LayoutSpecifierBase.occurence.occurence + lVar13) =
             *(undefined4 *)
              ((long)&(pSVar3->index).super_LayoutSpecifierBase.occurence.occurence + lVar13);
        *(undefined8 *)((long)&(pSVar7->index).super_LayoutSpecifierBase.val + lVar13) =
             *(undefined8 *)((long)&(pSVar3->index).super_LayoutSpecifierBase.val + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).fValues.super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).fValues.
                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).fValues.super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_finish + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).fValues.
                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).fValues.super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).fValues.
                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + lVar13);
        *(undefined8 *)
         ((long)&(pSVar3->embeddedRetVal).fValues.super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar13) = 0;
        puVar2 = (undefined8 *)
                 ((long)&(pSVar3->embeddedRetVal).fValues.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar13);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).iValues.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).iValues.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).iValues.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).iValues.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_finish + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).iValues.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).iValues.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar13);
        *(undefined8 *)
         ((long)&(pSVar3->embeddedRetVal).iValues.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar13) = 0;
        puVar2 = (undefined8 *)
                 ((long)&(pSVar3->embeddedRetVal).iValues.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar13);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).uValues.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).uValues.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).uValues.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).uValues.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_finish + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).uValues.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).uValues.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar13);
        *(undefined8 *)
         ((long)&(pSVar3->embeddedRetVal).uValues.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + lVar13) = 0;
        puVar2 = (undefined8 *)
                 ((long)&(pSVar3->embeddedRetVal).uValues.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar13);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined4 *)((long)&(pSVar7->embeddedRetVal).type.enumType + lVar13) =
             *(undefined4 *)((long)&(pSVar3->embeddedRetVal).type.enumType + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).type.arraySizesSegmented.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).type.arraySizesSegmented.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).type.arraySizesSegmented.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).type.arraySizesSegmented.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).type.arraySizesSegmented.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).type.arraySizesSegmented.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage + lVar13);
        *(undefined8 *)
         ((long)&(pSVar3->embeddedRetVal).type.arraySizesSegmented.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + lVar13) = 0;
        puVar2 = (undefined8 *)
                 ((long)&(pSVar3->embeddedRetVal).type.arraySizesSegmented.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar13);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined4 *)((long)&(pSVar7->embeddedRetVal).type.arraySize + lVar13) =
             *(undefined4 *)((long)&(pSVar3->embeddedRetVal).type.arraySize + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).type.childTypes.
                 super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).type.childTypes.
                      super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).type.childTypes.
                 super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                 ._M_impl.super__Vector_impl_data._M_finish + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).type.childTypes.
                      super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                      ._M_impl.super__Vector_impl_data._M_finish + lVar13);
        *(undefined8 *)
         ((long)&(pSVar7->embeddedRetVal).type.childTypes.
                 super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).type.childTypes.
                      super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar13);
        *(undefined8 *)
         ((long)&(pSVar3->embeddedRetVal).type.childTypes.
                 super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar13) = 0;
        puVar2 = (undefined8 *)
                 ((long)&(pSVar3->embeddedRetVal).type.childTypes.
                         super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar13);
        *puVar2 = 0;
        puVar2[1] = 0;
        pcVar8 = (pSVar7->embeddedRetVal).type.strType.field_2._M_local_buf + lVar13;
        *(char **)((long)&(pSVar7->embeddedRetVal).type.strType._M_dataplus._M_p + lVar13) = pcVar8;
        paVar4 = *(allocator_type **)
                  ((long)&(pSVar3->embeddedRetVal).type.strType._M_dataplus._M_p + lVar13);
        paVar10 = __a + 0xa8;
        if (paVar10 == paVar4) {
          uVar5 = *(undefined8 *)(__a + 0xb0);
          *(undefined8 *)pcVar8 = *(undefined8 *)paVar10;
          *(undefined8 *)((long)&(pSVar7->embeddedRetVal).type.strType.field_2 + lVar13 + 8) = uVar5
          ;
        }
        else {
          *(allocator_type **)
           ((long)&(pSVar7->embeddedRetVal).type.strType._M_dataplus._M_p + lVar13) = paVar4;
          *(undefined8 *)((long)&(pSVar7->embeddedRetVal).type.strType.field_2 + lVar13) =
               *(undefined8 *)paVar10;
        }
        *(undefined8 *)((long)&(pSVar7->embeddedRetVal).type.strType._M_string_length + lVar13) =
             *(undefined8 *)((long)&(pSVar3->embeddedRetVal).type.strType._M_string_length + lVar13)
        ;
        *(allocator_type **)((long)&(pSVar3->embeddedRetVal).type.strType._M_dataplus._M_p + lVar13)
             = paVar10;
        *(undefined8 *)((long)&(pSVar3->embeddedRetVal).type.strType._M_string_length + lVar13) = 0;
        (pSVar3->embeddedRetVal).type.strType.field_2._M_local_buf[lVar13] = '\0';
        pcVar8 = (pSVar7->embeddedRetVal).type.refStrType.field_2._M_local_buf + lVar13;
        *(char **)((long)&(pSVar7->embeddedRetVal).type.refStrType._M_dataplus._M_p + lVar13) =
             pcVar8;
        __p = *(SubroutineFunction **)
               ((long)&(pSVar3->embeddedRetVal).type.refStrType._M_dataplus._M_p + lVar13);
        pSVar11 = (SubroutineFunction *)(__a + 200);
        if (pSVar11 == __p) {
          uVar5 = *(undefined8 *)(__a + 0xd0);
          *(undefined8 *)pcVar8 = *(undefined8 *)&(pSVar11->index).super_LayoutSpecifierBase;
          *(undefined8 *)((long)&(pSVar7->embeddedRetVal).type.refStrType.field_2 + lVar13 + 8) =
               uVar5;
        }
        else {
          *(SubroutineFunction **)
           ((long)&(pSVar7->embeddedRetVal).type.refStrType._M_dataplus._M_p + lVar13) = __p;
          *(undefined8 *)((long)&(pSVar7->embeddedRetVal).type.refStrType.field_2 + lVar13) =
               *(undefined8 *)&(pSVar11->index).super_LayoutSpecifierBase;
        }
        *(undefined8 *)((long)&(pSVar7->embeddedRetVal).type.refStrType._M_string_length + lVar13) =
             *(undefined8 *)
              ((long)&(pSVar3->embeddedRetVal).type.refStrType._M_string_length + lVar13);
        *(SubroutineFunction **)
         ((long)&(pSVar3->embeddedRetVal).type.refStrType._M_dataplus._M_p + lVar13) = pSVar11;
        *(undefined8 *)((long)&(pSVar3->embeddedRetVal).type.refStrType._M_string_length + lVar13) =
             0;
        (pSVar3->embeddedRetVal).type.refStrType.field_2._M_local_buf[lVar13] = '\0';
        uVar5 = *(undefined8 *)((long)&(pSVar3->embeddedRetVal).type.size.first + lVar13);
        *(undefined8 *)((long)&(pSVar7->embeddedRetVal).type.size.second + lVar13 + 2) =
             *(undefined8 *)((long)&(pSVar3->embeddedRetVal).type.size.second + lVar13 + 2);
        *(undefined8 *)((long)&(pSVar7->embeddedRetVal).type.size.first + lVar13) = uVar5;
        pcVar8 = (pSVar7->name).field_2._M_local_buf + lVar13;
        *(char **)((long)&(pSVar7->name)._M_dataplus._M_p + lVar13) = pcVar8;
        paVar4 = *(allocator_type **)((long)&(pSVar3->name)._M_dataplus._M_p + lVar13);
        paVar10 = __a + 0xf8;
        if (paVar10 == paVar4) {
          uVar5 = *(undefined8 *)(__a + 0x100);
          *(undefined8 *)pcVar8 = *(undefined8 *)paVar10;
          *(undefined8 *)((long)&(pSVar7->name).field_2 + lVar13 + 8) = uVar5;
        }
        else {
          *(allocator_type **)((long)&(pSVar7->name)._M_dataplus._M_p + lVar13) = paVar4;
          *(undefined8 *)((long)&(pSVar7->name).field_2 + lVar13) = *(undefined8 *)paVar10;
        }
        *(undefined8 *)((long)&(pSVar7->name)._M_string_length + lVar13) =
             *(undefined8 *)((long)&(pSVar3->name)._M_string_length + lVar13);
        *(allocator_type **)((long)&(pSVar3->name)._M_dataplus._M_p + lVar13) = paVar10;
        *(undefined8 *)((long)&(pSVar3->name)._M_string_length + lVar13) = 0;
        (pSVar3->name).field_2._M_local_buf[lVar13] = '\0';
        std::allocator_traits<std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>::
        destroy<glcts::(anonymous_namespace)::SubroutineFunction>(__a,__p);
        lVar12 = lVar13 + 0x108;
      } while ((SubroutineFunction *)((long)&pSVar3[1].index.super_LayoutSpecifierBase.val + lVar13)
               != this_00);
      pSVar14 = (pointer)((long)&pSVar7[1].index.super_LayoutSpecifierBase.val + lVar13);
    }
    if (pSVar3 != (SubroutineFunction *)0x0) {
      operator_delete(pSVar3,(long)(this->fn).
                                   super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar3
                     );
    }
    (this->fn).
    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
    ._M_impl.super__Vector_impl_data._M_start = pSVar7;
    (this->fn).
    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar14 + 1;
    (this->fn).
    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar7 + (long)this_01;
  }
  else {
    SubroutineFunction::SubroutineFunction(this_00,_fn);
    ppSVar1 = &(this->fn).
               super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  return;
}

Assistant:

void push_back(const SubroutineFunction& _fn)
	{
		fn.push_back(_fn);
	}